

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O1

bool iutest::TestSuite::IsSuccessfulTest(TestInfo *p)

{
  bool bVar1;
  
  if (p->m_ran == true) {
    bVar1 = TestInfo::is_skipped(p);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = TestResult::Failed(&p->m_test_result);
      bVar1 = !bVar1;
    }
    return bVar1;
  }
  return false;
}

Assistant:

static bool IsSkipTest(const TestInfo* p) { return !p->is_ran() || p->is_skipped(); }